

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

uint32_t tb_hash_func(tb_page_addr_t phys_pc,target_ulong_conflict pc,uint32_t flags,
                     uint32_t cf_mask,uint32_t trace_vcpu_dstate)

{
  uint uVar1;
  uint32_t a;
  uint uVar2;
  uint uVar3;
  
  uVar1 = (int)phys_pc * -0x7a143589 + 0x24234429;
  uVar1 = uVar1 * 0x2000 | uVar1 >> 0x13;
  uVar2 = (int)(phys_pc >> 0x20) * -0x7a143589 + 0x85ebca78;
  uVar3 = uVar2 * 0x2000 | uVar2 >> 0x13;
  uVar2 = pc * -0x7a143589 + 1;
  uVar2 = uVar2 * 0x2000 | uVar2 >> 0x13;
  uVar1 = (uVar3 * 0x1bbcd880 | uVar3 * -0x61c8864f >> 0x19) +
          flags * -0x3d4d51c3 + (uVar1 * 0x3c6ef362 | (uint)((int)(uVar1 * -0x61c8864f) < 0)) +
          (uVar2 * 0x779b1000 | uVar2 * -0x61c8864f >> 0x14) + 0x91a7a6fd;
  uVar1 = cf_mask * -0x3d4d51c3 + (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  uVar1 = trace_vcpu_dstate * -0x3d4d51c3 + (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  uVar1 = (uVar1 * 0x20000 | uVar1 >> 0xf) * 0x27d4eb2f;
  uVar1 = (uVar1 >> 0xf ^ uVar1) * -0x7a143589;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * -0x3d4d51c3;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

static inline uint32_t
qemu_xxhash7(uint64_t ab, uint64_t cd, uint32_t e, uint32_t f, uint32_t g)
{
#ifdef _WIN32
    uint64_t v1x = QEMU_XXHASH_SEED;
    v1x += PRIME32_1;
    v1x += PRIME32_2;
    uint32_t v1 = v1x;
#else
    uint32_t v1 = QEMU_XXHASH_SEED + PRIME32_1 + PRIME32_2;
#endif
    uint32_t v2 = QEMU_XXHASH_SEED + PRIME32_2;
    uint32_t v3 = QEMU_XXHASH_SEED + 0;
    uint32_t v4 = QEMU_XXHASH_SEED - PRIME32_1;
    uint32_t a = ab;
    uint32_t b = ab >> 32;
    uint32_t c = cd;
    uint32_t d = cd >> 32;
    uint32_t h32;

    v1 += a * PRIME32_2;
    v1 = rol32(v1, 13);
    v1 *= PRIME32_1;

    v2 += b * PRIME32_2;
    v2 = rol32(v2, 13);
    v2 *= PRIME32_1;

    v3 += c * PRIME32_2;
    v3 = rol32(v3, 13);
    v3 *= PRIME32_1;

    v4 += d * PRIME32_2;
    v4 = rol32(v4, 13);
    v4 *= PRIME32_1;

    h32 = rol32(v1, 1) + rol32(v2, 7) + rol32(v3, 12) + rol32(v4, 18);
    h32 += 28;

    h32 += e * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 += f * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 += g * PRIME32_3;
    h32  = rol32(h32, 17) * PRIME32_4;

    h32 ^= h32 >> 15;
    h32 *= PRIME32_2;
    h32 ^= h32 >> 13;
    h32 *= PRIME32_3;
    h32 ^= h32 >> 16;

    return h32;
}